

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvbocu.cpp
# Opt level: O1

int32_t packDiff(int32_t diff)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if (diff < -0x40) {
    if (diff < -0x2911) {
      if (diff < -0x2dd0c) {
        iVar1 = (int)((ulong)((long)(diff + 0x2dd0c) * -0x7926fabb) >> 0x20) + diff + 0x2dd0c;
        iVar1 = (iVar1 >> 7) - (iVar1 >> 0x1f);
        iVar3 = diff + 0x2dd0c + iVar1 * -0xf3;
        uVar2 = iVar3 >> 0x1f;
        iVar1 = iVar1 + uVar2;
        uVar2 = uVar2 & iVar3 + 0xf3U;
        if ((int)uVar2 < 0x14) {
          uVar2 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                        [uVar2];
        }
        else {
          uVar2 = uVar2 + 0xd;
        }
        iVar3 = iVar1 % 0xf3;
        uVar4 = iVar3 >> 0x1f;
        iVar1 = iVar1 / 0xf3 + uVar4;
        uVar4 = uVar4 & iVar3 + 0xf3U;
        if ((int)uVar4 < 0x14) {
          iVar3 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                       [uVar4];
        }
        else {
          iVar3 = uVar4 + 0xd;
        }
        if (iVar1 < -0xdf) {
          iVar1 = (int)_ISCIIStaticData.name[(long)iVar1 + 0x3b];
        }
        else {
          iVar1 = iVar1 + 0x100;
        }
        return uVar2 | iVar3 << 8 | iVar1 << 0x10 | 0x21000000;
      }
      iVar1 = diff + (int)((ulong)((long)(diff + 0x2911) * -0x7926fabb) >> 0x20) + 0x2911;
      iVar1 = (iVar1 >> 7) - (iVar1 >> 0x1f);
      iVar3 = diff + 0x2911 + iVar1 * -0xf3;
      uVar2 = iVar3 >> 0x1f;
      iVar1 = iVar1 + uVar2;
      uVar2 = uVar2 & iVar3 + 0xf3U;
      if ((int)uVar2 < 0x14) {
        uVar2 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                      [uVar2];
      }
      else {
        uVar2 = uVar2 + 0xd;
      }
      iVar3 = iVar1 % 0xf3;
      uVar4 = iVar3 >> 0x1f;
      uVar5 = uVar4 & iVar3 + 0xf3U;
      if ((int)uVar5 < 0x14) {
        iVar3 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                     [uVar5];
      }
      else {
        iVar3 = uVar5 + 0xd;
      }
      uVar2 = (iVar1 / 0xf3 + uVar4) * 0x10000 + 0x250000 | uVar2 | iVar3 << 8;
      goto LAB_00342ff3;
    }
    iVar1 = diff + (int)((ulong)((long)(diff + 0x40) * -0x7926fabb) >> 0x20) + 0x40;
    iVar1 = (iVar1 >> 7) - (iVar1 >> 0x1f);
    iVar3 = diff + 0x40 + iVar1 * -0xf3;
    uVar2 = iVar3 >> 0x1f;
    uVar4 = uVar2 & iVar3 + 0xf3U;
    if ((int)uVar4 < 0x14) {
      uVar4 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                    [uVar4];
    }
    else {
      uVar4 = uVar4 + 0xd;
    }
    uVar2 = (iVar1 + uVar2) * 0x100 + 0x5000;
  }
  else {
    if (0x2910 < diff) {
      if (0x2dd0b < diff) {
        uVar2 = diff - 0x2dd0c;
        uVar4 = uVar2 % 0xf3;
        if (uVar4 < 0x14) {
          uVar4 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                        [uVar4];
        }
        else {
          uVar4 = uVar4 + 0xd;
        }
        uVar5 = uVar2 / 0xf3 + (uVar2 / 0xe6a9) * -0xf3;
        if (uVar5 < 0x14) {
          iVar1 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                       [uVar5];
        }
        else {
          iVar1 = uVar5 + 0xd;
        }
        if (uVar2 < 0x120534) {
          iVar3 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                       [uVar2 / 0xe6a9];
        }
        else {
          iVar3 = uVar2 / 0xe6a9 + 0xd;
        }
        return uVar4 | iVar1 << 8 | iVar3 << 0x10 | 0xfe000000;
      }
      uVar2 = diff - 0x2911;
      uVar4 = uVar2 % 0xf3;
      if (uVar4 < 0x14) {
        uVar4 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                      [uVar4];
      }
      else {
        uVar4 = uVar4 + 0xd;
      }
      uVar5 = uVar2 / 0xf3 + (uVar2 / 0xe6a9) * -0xf3;
      if (uVar5 < 0x14) {
        iVar1 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                     [uVar5];
      }
      else {
        iVar1 = uVar5 + 0xd;
      }
      uVar2 = (uVar2 / 0xe6a9) * 0x10000 + 0xfb0000 | uVar4 | iVar1 << 8;
LAB_00342ff3:
      return uVar2 | 0x3000000;
    }
    iVar1 = diff + (int)((ulong)((long)(diff + -0x40) * -0x7926fabb) >> 0x20) + -0x40;
    iVar1 = (iVar1 >> 7) - (iVar1 >> 0x1f);
    iVar3 = diff + -0x40 + iVar1 * -0xf3;
    if (iVar3 < 0x14) {
      uVar4 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                    [iVar3];
    }
    else {
      uVar4 = iVar3 + 0xd;
    }
    uVar2 = iVar1 * 0x100 + 0xd000;
  }
  return uVar2 | uVar4 | 0x2000000;
}

Assistant:

static int32_t
packDiff(int32_t diff) {
    int32_t result, m;

    U_ASSERT(!DIFF_IS_SINGLE(diff)); /* assume we won't be called where diff==BOCU1_REACH_NEG_1=-64 */
    if(diff>=BOCU1_REACH_NEG_1) {
        /* mostly positive differences, and single-byte negative ones */
#if 0   /* single-byte case handled in macros, see below */
        if(diff<=BOCU1_REACH_POS_1) {
            /* single byte */
            return 0x01000000|(BOCU1_MIDDLE+diff);
        } else
#endif
        if(diff<=BOCU1_REACH_POS_2) {
            /* two bytes */
            diff-=BOCU1_REACH_POS_1+1;
            result=0x02000000;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m);

            result|=(BOCU1_START_POS_2+diff)<<8;
        } else if(diff<=BOCU1_REACH_POS_3) {
            /* three bytes */
            diff-=BOCU1_REACH_POS_2+1;
            result=0x03000000;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m);

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            result|=(BOCU1_START_POS_3+diff)<<16;
        } else {
            /* four bytes */
            diff-=BOCU1_REACH_POS_3+1;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result=BOCU1_TRAIL_TO_BYTE(m);

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            /*
             * We know that / and % would deliver quotient 0 and rest=diff.
             * Avoid division and modulo for performance.
             */
            result|=BOCU1_TRAIL_TO_BYTE(diff)<<16;

            result|=((uint32_t)BOCU1_START_POS_4)<<24;
        }
    } else {
        /* two- to four-byte negative differences */
        if(diff>=BOCU1_REACH_NEG_2) {
            /* two bytes */
            diff-=BOCU1_REACH_NEG_1;
            result=0x02000000;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m);

            result|=(BOCU1_START_NEG_2+diff)<<8;
        } else if(diff>=BOCU1_REACH_NEG_3) {
            /* three bytes */
            diff-=BOCU1_REACH_NEG_2;
            result=0x03000000;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m);

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            result|=(BOCU1_START_NEG_3+diff)<<16;
        } else {
            /* four bytes */
            diff-=BOCU1_REACH_NEG_3;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result=BOCU1_TRAIL_TO_BYTE(m);

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            /*
             * We know that NEGDIVMOD would deliver
             * quotient -1 and rest=diff+BOCU1_TRAIL_COUNT.
             * Avoid division and modulo for performance.
             */
            m=diff+BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<16;

            result|=BOCU1_MIN<<24;
        }
    }
    return result;
}